

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void VFilter8i_SSE2(uint8_t *u,uint8_t *v,int stride,int thresh,int ithresh,int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i t_1;
  undefined1 auVar10 [16];
  byte bVar11;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  undefined1 auVar12 [16];
  undefined1 auVar18 [16];
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar32;
  byte bVar35;
  byte bVar39;
  byte bVar42;
  byte bVar44;
  byte bVar46;
  byte bVar48;
  byte bVar50;
  byte bVar52;
  byte bVar54;
  byte bVar56;
  byte bVar58;
  byte bVar60;
  byte bVar62;
  undefined1 auVar29 [16];
  byte bVar33;
  undefined1 uVar34;
  byte bVar36;
  undefined1 uVar37;
  byte bVar40;
  undefined1 uVar41;
  byte bVar43;
  byte bVar45;
  byte bVar47;
  byte bVar49;
  byte bVar51;
  byte bVar53;
  byte bVar55;
  byte bVar57;
  byte bVar59;
  byte bVar61;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  undefined1 auVar30 [16];
  byte bVar38;
  undefined1 auVar31 [16];
  byte bVar66;
  byte bVar82;
  byte bVar84;
  byte bVar86;
  byte bVar88;
  byte bVar90;
  byte bVar92;
  byte bVar94;
  byte bVar96;
  byte bVar98;
  byte bVar100;
  byte bVar102;
  byte bVar104;
  byte bVar106;
  byte bVar108;
  undefined1 auVar68 [16];
  byte bVar110;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  char cVar67;
  char cVar83;
  char cVar85;
  char cVar87;
  char cVar89;
  char cVar91;
  char cVar93;
  char cVar95;
  char cVar97;
  char cVar99;
  char cVar101;
  char cVar103;
  char cVar105;
  char cVar107;
  char cVar109;
  char cVar111;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  
  auVar8._8_8_ = *(undefined8 *)v;
  auVar8._0_8_ = *(undefined8 *)u;
  lVar7 = (long)stride;
  auVar70._8_8_ = *(undefined8 *)(v + lVar7);
  auVar70._0_8_ = *(undefined8 *)(u + lVar7);
  auVar81._8_8_ = *(undefined8 *)(v + lVar7 * 2);
  auVar81._0_8_ = *(undefined8 *)(u + lVar7 * 2);
  auVar18._8_8_ = *(undefined8 *)(v + lVar7 * 3);
  auVar18._0_8_ = *(undefined8 *)(u + lVar7 * 3);
  auVar9 = psubusb(auVar18,auVar81);
  auVar10 = psubusb(auVar81,auVar18);
  auVar10 = auVar10 | auVar9;
  auVar9 = psubusb(auVar70,auVar8);
  auVar8 = psubusb(auVar8,auVar70);
  auVar8 = auVar8 | auVar9;
  auVar9 = psubusb(auVar81,auVar70);
  auVar29 = psubusb(auVar70,auVar81);
  auVar29 = auVar29 | auVar9;
  bVar11 = auVar8[0];
  bVar26 = auVar29[0];
  bVar26 = (bVar26 < bVar11) * bVar11 | (bVar26 >= bVar11) * bVar26;
  bVar11 = auVar8[1];
  bVar19 = auVar29[1];
  bVar32 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[2];
  bVar19 = auVar29[2];
  bVar35 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[3];
  bVar19 = auVar29[3];
  bVar39 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[4];
  bVar19 = auVar29[4];
  bVar42 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[5];
  bVar19 = auVar29[5];
  bVar44 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[6];
  bVar19 = auVar29[6];
  bVar46 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[7];
  bVar19 = auVar29[7];
  bVar48 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[8];
  bVar19 = auVar29[8];
  bVar50 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[9];
  bVar19 = auVar29[9];
  bVar52 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[10];
  bVar19 = auVar29[10];
  bVar54 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[0xb];
  bVar19 = auVar29[0xb];
  bVar56 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[0xc];
  bVar19 = auVar29[0xc];
  bVar58 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[0xd];
  bVar19 = auVar29[0xd];
  bVar60 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[0xe];
  bVar19 = auVar29[0xe];
  bVar20 = auVar29[0xf];
  bVar62 = (bVar19 < bVar11) * bVar11 | (bVar19 >= bVar11) * bVar19;
  bVar11 = auVar8[0xf];
  bVar64 = (bVar20 < bVar11) * bVar11 | (bVar20 >= bVar11) * bVar20;
  bVar11 = auVar10[0];
  bVar27 = (bVar26 < bVar11) * bVar11 | (bVar26 >= bVar11) * bVar26;
  bVar19 = auVar10[1];
  bVar33 = (bVar32 < bVar19) * bVar19 | (bVar32 >= bVar19) * bVar32;
  bVar20 = auVar10[2];
  bVar36 = (bVar35 < bVar20) * bVar20 | (bVar35 >= bVar20) * bVar35;
  bVar21 = auVar10[3];
  bVar40 = (bVar39 < bVar21) * bVar21 | (bVar39 >= bVar21) * bVar39;
  bVar22 = auVar10[4];
  bVar43 = (bVar42 < bVar22) * bVar22 | (bVar42 >= bVar22) * bVar42;
  bVar23 = auVar10[5];
  bVar45 = (bVar44 < bVar23) * bVar23 | (bVar44 >= bVar23) * bVar44;
  bVar24 = auVar10[6];
  bVar47 = (bVar46 < bVar24) * bVar24 | (bVar46 >= bVar24) * bVar46;
  bVar25 = auVar10[7];
  bVar49 = (bVar48 < bVar25) * bVar25 | (bVar48 >= bVar25) * bVar48;
  bVar28 = auVar10[8];
  bVar51 = (bVar50 < bVar28) * bVar28 | (bVar50 >= bVar28) * bVar50;
  bVar38 = auVar10[9];
  bVar53 = (bVar52 < bVar38) * bVar38 | (bVar52 >= bVar38) * bVar52;
  bVar1 = auVar10[10];
  bVar55 = (bVar54 < bVar1) * bVar1 | (bVar54 >= bVar1) * bVar54;
  bVar2 = auVar10[0xb];
  bVar57 = (bVar56 < bVar2) * bVar2 | (bVar56 >= bVar2) * bVar56;
  bVar3 = auVar10[0xc];
  bVar59 = (bVar58 < bVar3) * bVar3 | (bVar58 >= bVar3) * bVar58;
  bVar4 = auVar10[0xd];
  bVar61 = (bVar60 < bVar4) * bVar4 | (bVar60 >= bVar4) * bVar60;
  bVar5 = auVar10[0xe];
  bVar63 = (bVar62 < bVar5) * bVar5 | (bVar62 >= bVar5) * bVar62;
  bVar6 = auVar10[0xf];
  bVar65 = (bVar64 < bVar6) * bVar6 | (bVar64 >= bVar6) * bVar64;
  auVar9._8_8_ = *(undefined8 *)(v + lVar7 * 4);
  auVar9._0_8_ = *(undefined8 *)(u + lVar7 * 4);
  auVar10._8_8_ = *(undefined8 *)(v + lVar7 * 5);
  auVar10._0_8_ = *(undefined8 *)(u + lVar7 * 5);
  auVar112._8_8_ = *(undefined8 *)(v + lVar7 * 6);
  auVar112._0_8_ = *(undefined8 *)(u + lVar7 * 6);
  auVar68._8_8_ = *(undefined8 *)(v + lVar7 * 7);
  auVar68._0_8_ = *(undefined8 *)(u + lVar7 * 7);
  auVar29 = psubusb(auVar9,auVar10);
  auVar8 = psubusb(auVar10,auVar9);
  auVar8 = auVar8 | auVar29;
  auVar113 = psubusb(auVar112,auVar68);
  auVar29 = psubusb(auVar68,auVar112);
  auVar29 = auVar29 | auVar113;
  bVar26 = auVar8[0];
  bVar32 = auVar29[0];
  bVar66 = (bVar32 < bVar26) * bVar26 | (bVar32 >= bVar26) * bVar32;
  bVar32 = auVar8[1];
  bVar35 = auVar29[1];
  bVar82 = (bVar35 < bVar32) * bVar32 | (bVar35 >= bVar32) * bVar35;
  bVar35 = auVar8[2];
  bVar39 = auVar29[2];
  bVar84 = (bVar39 < bVar35) * bVar35 | (bVar39 >= bVar35) * bVar39;
  bVar39 = auVar8[3];
  bVar42 = auVar29[3];
  bVar86 = (bVar42 < bVar39) * bVar39 | (bVar42 >= bVar39) * bVar42;
  bVar42 = auVar8[4];
  bVar44 = auVar29[4];
  bVar88 = (bVar44 < bVar42) * bVar42 | (bVar44 >= bVar42) * bVar44;
  bVar44 = auVar8[5];
  bVar46 = auVar29[5];
  bVar90 = (bVar46 < bVar44) * bVar44 | (bVar46 >= bVar44) * bVar46;
  bVar46 = auVar8[6];
  bVar48 = auVar29[6];
  bVar92 = (bVar48 < bVar46) * bVar46 | (bVar48 >= bVar46) * bVar48;
  bVar48 = auVar8[7];
  bVar50 = auVar29[7];
  bVar94 = (bVar50 < bVar48) * bVar48 | (bVar50 >= bVar48) * bVar50;
  bVar50 = auVar8[8];
  bVar52 = auVar29[8];
  bVar96 = (bVar52 < bVar50) * bVar50 | (bVar52 >= bVar50) * bVar52;
  bVar52 = auVar8[9];
  bVar54 = auVar29[9];
  bVar98 = (bVar54 < bVar52) * bVar52 | (bVar54 >= bVar52) * bVar54;
  bVar54 = auVar8[10];
  bVar56 = auVar29[10];
  bVar100 = (bVar56 < bVar54) * bVar54 | (bVar56 >= bVar54) * bVar56;
  bVar56 = auVar8[0xb];
  bVar58 = auVar29[0xb];
  bVar102 = (bVar58 < bVar56) * bVar56 | (bVar58 >= bVar56) * bVar58;
  bVar58 = auVar8[0xc];
  bVar60 = auVar29[0xc];
  bVar104 = (bVar60 < bVar58) * bVar58 | (bVar60 >= bVar58) * bVar60;
  bVar60 = auVar8[0xd];
  bVar62 = auVar29[0xd];
  bVar106 = (bVar62 < bVar60) * bVar60 | (bVar62 >= bVar60) * bVar62;
  bVar62 = auVar8[0xe];
  bVar64 = auVar29[0xe];
  bVar110 = auVar29[0xf];
  bVar108 = (bVar64 < bVar62) * bVar62 | (bVar64 >= bVar62) * bVar64;
  bVar64 = auVar8[0xf];
  bVar110 = (bVar110 < bVar64) * bVar64 | (bVar110 >= bVar64) * bVar110;
  bVar27 = (bVar66 < bVar27) * bVar27 | (bVar66 >= bVar27) * bVar66;
  bVar33 = (bVar82 < bVar33) * bVar33 | (bVar82 >= bVar33) * bVar82;
  bVar36 = (bVar84 < bVar36) * bVar36 | (bVar84 >= bVar36) * bVar84;
  bVar40 = (bVar86 < bVar40) * bVar40 | (bVar86 >= bVar40) * bVar86;
  bVar43 = (bVar88 < bVar43) * bVar43 | (bVar88 >= bVar43) * bVar88;
  bVar45 = (bVar90 < bVar45) * bVar45 | (bVar90 >= bVar45) * bVar90;
  bVar47 = (bVar92 < bVar47) * bVar47 | (bVar92 >= bVar47) * bVar92;
  bVar49 = (bVar94 < bVar49) * bVar49 | (bVar94 >= bVar49) * bVar94;
  bVar51 = (bVar96 < bVar51) * bVar51 | (bVar96 >= bVar51) * bVar96;
  bVar53 = (bVar98 < bVar53) * bVar53 | (bVar98 >= bVar53) * bVar98;
  bVar55 = (bVar100 < bVar55) * bVar55 | (bVar100 >= bVar55) * bVar100;
  bVar57 = (bVar102 < bVar57) * bVar57 | (bVar102 >= bVar57) * bVar102;
  bVar59 = (bVar104 < bVar59) * bVar59 | (bVar104 >= bVar59) * bVar104;
  bVar61 = (bVar106 < bVar61) * bVar61 | (bVar106 >= bVar61) * bVar106;
  bVar63 = (bVar108 < bVar63) * bVar63 | (bVar108 >= bVar63) * bVar108;
  bVar65 = (bVar110 < bVar65) * bVar65 | (bVar110 >= bVar65) * bVar110;
  auVar8 = psubusb(auVar10,auVar112);
  auVar29 = psubusb(auVar112,auVar10);
  auVar29 = auVar29 | auVar8;
  bVar66 = auVar29[0];
  bVar66 = (bVar66 < bVar27) * bVar27 | (bVar66 >= bVar27) * bVar66;
  bVar27 = auVar29[1];
  bVar82 = (bVar27 < bVar33) * bVar33 | (bVar27 >= bVar33) * bVar27;
  bVar27 = auVar29[2];
  bVar84 = (bVar27 < bVar36) * bVar36 | (bVar27 >= bVar36) * bVar27;
  bVar27 = auVar29[3];
  bVar86 = (bVar27 < bVar40) * bVar40 | (bVar27 >= bVar40) * bVar27;
  bVar27 = auVar29[4];
  bVar43 = (bVar27 < bVar43) * bVar43 | (bVar27 >= bVar43) * bVar27;
  bVar27 = auVar29[5];
  bVar45 = (bVar27 < bVar45) * bVar45 | (bVar27 >= bVar45) * bVar27;
  bVar27 = auVar29[6];
  bVar47 = (bVar27 < bVar47) * bVar47 | (bVar27 >= bVar47) * bVar27;
  bVar27 = auVar29[7];
  bVar49 = (bVar27 < bVar49) * bVar49 | (bVar27 >= bVar49) * bVar27;
  bVar27 = auVar29[8];
  bVar51 = (bVar27 < bVar51) * bVar51 | (bVar27 >= bVar51) * bVar27;
  bVar27 = auVar29[9];
  bVar53 = (bVar27 < bVar53) * bVar53 | (bVar27 >= bVar53) * bVar27;
  bVar27 = auVar29[10];
  bVar55 = (bVar27 < bVar55) * bVar55 | (bVar27 >= bVar55) * bVar27;
  bVar27 = auVar29[0xb];
  bVar57 = (bVar27 < bVar57) * bVar57 | (bVar27 >= bVar57) * bVar27;
  bVar27 = auVar29[0xc];
  bVar59 = (bVar27 < bVar59) * bVar59 | (bVar27 >= bVar59) * bVar27;
  bVar27 = auVar29[0xd];
  bVar61 = (bVar27 < bVar61) * bVar61 | (bVar27 >= bVar61) * bVar27;
  bVar27 = auVar29[0xe];
  bVar33 = auVar29[0xf];
  bVar63 = (bVar27 < bVar63) * bVar63 | (bVar27 >= bVar63) * bVar27;
  bVar65 = (bVar33 < bVar65) * bVar65 | (bVar33 >= bVar65) * bVar33;
  uVar41 = (undefined1)((uint)ithresh >> 0x18);
  uVar37 = (undefined1)((uint)ithresh >> 0x10);
  uVar34 = (undefined1)((uint)ithresh >> 8);
  auVar115._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar41,uVar41),uVar37),CONCAT14(uVar37,ithresh)) >> 0x20);
  auVar115[3] = uVar34;
  auVar115[2] = uVar34;
  auVar115[0] = (undefined1)ithresh;
  auVar115[1] = auVar115[0];
  auVar115._8_8_ = 0;
  auVar8 = pshuflw(auVar115,auVar115,0);
  bVar27 = auVar8[0];
  bVar33 = auVar8[1];
  bVar36 = auVar8[2];
  bVar40 = auVar8[3];
  auVar69[0] = -((byte)((bVar66 < bVar27) * bVar66 | (bVar66 >= bVar27) * bVar27) == bVar66);
  auVar69[1] = -((byte)((bVar82 < bVar33) * bVar82 | (bVar82 >= bVar33) * bVar33) == bVar82);
  auVar69[2] = -((byte)((bVar84 < bVar36) * bVar84 | (bVar84 >= bVar36) * bVar36) == bVar84);
  auVar69[3] = -((byte)((bVar86 < bVar40) * bVar86 | (bVar86 >= bVar40) * bVar40) == bVar86);
  auVar69[4] = -((byte)((bVar43 < bVar27) * bVar43 | (bVar43 >= bVar27) * bVar27) == bVar43);
  auVar69[5] = -((byte)((bVar45 < bVar33) * bVar45 | (bVar45 >= bVar33) * bVar33) == bVar45);
  auVar69[6] = -((byte)((bVar47 < bVar36) * bVar47 | (bVar47 >= bVar36) * bVar36) == bVar47);
  auVar69[7] = -((byte)((bVar49 < bVar40) * bVar49 | (bVar49 >= bVar40) * bVar40) == bVar49);
  auVar69[8] = -((byte)((bVar51 < bVar27) * bVar51 | (bVar51 >= bVar27) * bVar27) == bVar51);
  auVar69[9] = -((byte)((bVar53 < bVar33) * bVar53 | (bVar53 >= bVar33) * bVar33) == bVar53);
  auVar69[10] = -((byte)((bVar55 < bVar36) * bVar55 | (bVar55 >= bVar36) * bVar36) == bVar55);
  auVar69[0xb] = -((byte)((bVar57 < bVar40) * bVar57 | (bVar57 >= bVar40) * bVar40) == bVar57);
  auVar69[0xc] = -((byte)((bVar59 < bVar27) * bVar59 | (bVar59 >= bVar27) * bVar27) == bVar59);
  auVar69[0xd] = -((byte)((bVar61 < bVar33) * bVar61 | (bVar61 >= bVar33) * bVar33) == bVar61);
  auVar69[0xe] = -((byte)((bVar63 < bVar36) * bVar63 | (bVar63 >= bVar36) * bVar36) == bVar63);
  auVar69[0xf] = -((byte)((bVar65 < bVar40) * bVar65 | (bVar65 >= bVar40) * bVar40) == bVar65);
  uVar41 = (undefined1)((uint)thresh >> 0x18);
  uVar37 = (undefined1)((uint)thresh >> 0x10);
  uVar34 = (undefined1)((uint)thresh >> 8);
  auVar118._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar41,uVar41),uVar37),CONCAT14(uVar37,thresh)) >> 0x20);
  auVar118[3] = uVar34;
  auVar118[2] = uVar34;
  auVar118[0] = (undefined1)thresh;
  auVar118[1] = auVar118[0];
  auVar118._8_8_ = 0;
  auVar8 = pshuflw(auVar118,auVar118,0);
  auVar29 = psubusb(auVar10,auVar81);
  auVar113 = psubusb(auVar81,auVar10);
  auVar113 = auVar113 | auVar29;
  auVar114._0_2_ = auVar113._0_2_ >> 1;
  auVar114._2_2_ = auVar113._2_2_ >> 1;
  auVar114._4_2_ = auVar113._4_2_ >> 1;
  auVar114._6_2_ = auVar113._6_2_ >> 1;
  auVar114._8_2_ = auVar113._8_2_ >> 1;
  auVar114._10_2_ = auVar113._10_2_ >> 1;
  auVar114._12_2_ = auVar113._12_2_ >> 1;
  auVar114._14_2_ = auVar113._14_2_ >> 1;
  auVar29 = psubusb(auVar9,auVar18);
  auVar113 = psubusb(auVar18,auVar9);
  auVar29 = paddusb(auVar113 | auVar29,auVar113 | auVar29);
  auVar29 = paddusb(auVar114 & _DAT_001b8120,auVar29);
  bVar27 = auVar29[0];
  bVar66 = auVar8[0];
  bVar33 = auVar29[1];
  bVar82 = auVar8[1];
  bVar36 = auVar29[2];
  bVar84 = auVar8[2];
  bVar40 = auVar29[3];
  bVar86 = auVar8[3];
  bVar43 = auVar29[4];
  bVar45 = auVar29[5];
  bVar47 = auVar29[6];
  bVar49 = auVar29[7];
  bVar51 = auVar29[8];
  bVar53 = auVar29[9];
  bVar55 = auVar29[10];
  bVar57 = auVar29[0xb];
  bVar59 = auVar29[0xc];
  bVar61 = auVar29[0xd];
  bVar63 = auVar29[0xe];
  bVar65 = auVar29[0xf];
  auVar117[0] = -((byte)((bVar27 < bVar66) * bVar27 | (bVar27 >= bVar66) * bVar66) == bVar27);
  auVar117[1] = -((byte)((bVar33 < bVar82) * bVar33 | (bVar33 >= bVar82) * bVar82) == bVar33);
  auVar117[2] = -((byte)((bVar36 < bVar84) * bVar36 | (bVar36 >= bVar84) * bVar84) == bVar36);
  auVar117[3] = -((byte)((bVar40 < bVar86) * bVar40 | (bVar40 >= bVar86) * bVar86) == bVar40);
  auVar117[4] = -((byte)((bVar43 < bVar66) * bVar43 | (bVar43 >= bVar66) * bVar66) == bVar43);
  auVar117[5] = -((byte)((bVar45 < bVar82) * bVar45 | (bVar45 >= bVar82) * bVar82) == bVar45);
  auVar117[6] = -((byte)((bVar47 < bVar84) * bVar47 | (bVar47 >= bVar84) * bVar84) == bVar47);
  auVar117[7] = -((byte)((bVar49 < bVar86) * bVar49 | (bVar49 >= bVar86) * bVar86) == bVar49);
  auVar117[8] = -((byte)((bVar51 < bVar66) * bVar51 | (bVar51 >= bVar66) * bVar66) == bVar51);
  auVar117[9] = -((byte)((bVar53 < bVar82) * bVar53 | (bVar53 >= bVar82) * bVar82) == bVar53);
  auVar117[10] = -((byte)((bVar55 < bVar84) * bVar55 | (bVar55 >= bVar84) * bVar84) == bVar55);
  auVar117[0xb] = -((byte)((bVar57 < bVar86) * bVar57 | (bVar57 >= bVar86) * bVar86) == bVar57);
  auVar117[0xc] = -((byte)((bVar59 < bVar66) * bVar59 | (bVar59 >= bVar66) * bVar66) == bVar59);
  auVar117[0xd] = -((byte)((bVar61 < bVar82) * bVar61 | (bVar61 >= bVar82) * bVar82) == bVar61);
  auVar117[0xe] = -((byte)((bVar63 < bVar84) * bVar63 | (bVar63 >= bVar84) * bVar84) == bVar63);
  auVar117[0xf] = -((byte)((bVar65 < bVar86) * bVar65 | (bVar65 >= bVar86) * bVar86) == bVar65);
  uVar41 = (undefined1)((uint)hev_thresh >> 0x18);
  uVar37 = (undefined1)((uint)hev_thresh >> 0x10);
  uVar34 = (undefined1)((uint)hev_thresh >> 8);
  auVar30._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar41,uVar41),uVar37),CONCAT14(uVar37,hev_thresh)) >> 0x20)
  ;
  auVar30[3] = uVar34;
  auVar30[2] = uVar34;
  auVar30[0] = (undefined1)hev_thresh;
  auVar30[1] = auVar30[0];
  auVar30._8_8_ = 0;
  auVar8 = pshuflw(auVar30,auVar30,0);
  bVar11 = (bVar26 < bVar11) * bVar11 | (bVar26 >= bVar11) * bVar26;
  bVar26 = (bVar32 < bVar19) * bVar19 | (bVar32 >= bVar19) * bVar32;
  bVar19 = (bVar35 < bVar20) * bVar20 | (bVar35 >= bVar20) * bVar35;
  bVar32 = (bVar39 < bVar21) * bVar21 | (bVar39 >= bVar21) * bVar39;
  bVar20 = (bVar42 < bVar22) * bVar22 | (bVar42 >= bVar22) * bVar42;
  bVar35 = (bVar44 < bVar23) * bVar23 | (bVar44 >= bVar23) * bVar44;
  bVar21 = (bVar46 < bVar24) * bVar24 | (bVar46 >= bVar24) * bVar46;
  bVar39 = (bVar48 < bVar25) * bVar25 | (bVar48 >= bVar25) * bVar48;
  bVar22 = (bVar50 < bVar28) * bVar28 | (bVar50 >= bVar28) * bVar50;
  bVar42 = (bVar52 < bVar38) * bVar38 | (bVar52 >= bVar38) * bVar52;
  bVar23 = (bVar54 < bVar1) * bVar1 | (bVar54 >= bVar1) * bVar54;
  bVar44 = (bVar56 < bVar2) * bVar2 | (bVar56 >= bVar2) * bVar56;
  bVar24 = (bVar58 < bVar3) * bVar3 | (bVar58 >= bVar3) * bVar58;
  bVar46 = (bVar60 < bVar4) * bVar4 | (bVar60 >= bVar4) * bVar60;
  bVar25 = (bVar62 < bVar5) * bVar5 | (bVar62 >= bVar5) * bVar62;
  bVar48 = (bVar64 < bVar6) * bVar6 | (bVar64 >= bVar6) * bVar64;
  bVar28 = auVar8[0];
  bVar50 = auVar8[1];
  bVar38 = auVar8[2];
  bVar52 = auVar8[3];
  auVar31[0] = -((byte)((bVar11 < bVar28) * bVar11 | (bVar11 >= bVar28) * bVar28) == bVar11);
  auVar31[1] = -((byte)((bVar26 < bVar50) * bVar26 | (bVar26 >= bVar50) * bVar50) == bVar26);
  auVar31[2] = -((byte)((bVar19 < bVar38) * bVar19 | (bVar19 >= bVar38) * bVar38) == bVar19);
  auVar31[3] = -((byte)((bVar32 < bVar52) * bVar32 | (bVar32 >= bVar52) * bVar52) == bVar32);
  auVar31[4] = -((byte)((bVar20 < bVar28) * bVar20 | (bVar20 >= bVar28) * bVar28) == bVar20);
  auVar31[5] = -((byte)((bVar35 < bVar50) * bVar35 | (bVar35 >= bVar50) * bVar50) == bVar35);
  auVar31[6] = -((byte)((bVar21 < bVar38) * bVar21 | (bVar21 >= bVar38) * bVar38) == bVar21);
  auVar31[7] = -((byte)((bVar39 < bVar52) * bVar39 | (bVar39 >= bVar52) * bVar52) == bVar39);
  auVar31[8] = -((byte)((bVar22 < bVar28) * bVar22 | (bVar22 >= bVar28) * bVar28) == bVar22);
  auVar31[9] = -((byte)((bVar42 < bVar50) * bVar42 | (bVar42 >= bVar50) * bVar50) == bVar42);
  auVar31[10] = -((byte)((bVar23 < bVar38) * bVar23 | (bVar23 >= bVar38) * bVar38) == bVar23);
  auVar31[0xb] = -((byte)((bVar44 < bVar52) * bVar44 | (bVar44 >= bVar52) * bVar52) == bVar44);
  auVar31[0xc] = -((byte)((bVar24 < bVar28) * bVar24 | (bVar24 >= bVar28) * bVar28) == bVar24);
  auVar31[0xd] = -((byte)((bVar46 < bVar50) * bVar46 | (bVar46 >= bVar50) * bVar50) == bVar46);
  auVar31[0xe] = -((byte)((bVar25 < bVar38) * bVar25 | (bVar25 >= bVar38) * bVar38) == bVar25);
  auVar31[0xf] = -((byte)((bVar48 < bVar52) * bVar48 | (bVar48 >= bVar52) * bVar52) == bVar48);
  auVar8 = psubsb(auVar81 ^ _DAT_001b71b0,auVar10 ^ _DAT_001b71b0);
  auVar115 = psubsb(auVar9 ^ _DAT_001b71b0,auVar18 ^ _DAT_001b71b0);
  auVar29 = paddsb(~auVar31 & auVar8,auVar115);
  auVar29 = paddsb(auVar29,auVar115);
  auVar29 = paddsb(auVar29,auVar115);
  auVar117 = auVar29 & auVar69 & auVar117;
  auVar70 = paddsb(_DAT_001b8130,auVar117);
  auVar118 = paddsb(auVar117,_DAT_001b8140);
  auVar29._0_14_ = auVar8._0_14_;
  auVar29[0xe] = auVar8[7];
  auVar29[0xf] = auVar70[7];
  auVar113._14_2_ = auVar29._14_2_;
  auVar113._0_13_ = auVar8._0_13_;
  auVar113[0xd] = auVar70[6];
  auVar17._13_3_ = auVar113._13_3_;
  auVar17._0_12_ = auVar8._0_12_;
  auVar17[0xc] = auVar8[6];
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_11_ = auVar8._0_11_;
  auVar16[0xb] = auVar70[5];
  auVar15._11_5_ = auVar16._11_5_;
  auVar15._0_10_ = auVar8._0_10_;
  auVar15[10] = auVar8[5];
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_9_ = auVar8._0_9_;
  auVar14[9] = auVar70[4];
  auVar13._9_7_ = auVar14._9_7_;
  auVar13._0_8_ = auVar8._0_8_;
  auVar13[8] = auVar8[4];
  auVar12._8_8_ = auVar13._8_8_;
  auVar12[7] = auVar70[3];
  auVar12[6] = auVar8[3];
  auVar12[5] = auVar70[2];
  auVar12[4] = auVar8[2];
  auVar12[3] = auVar70[1];
  auVar12[2] = auVar8[1];
  auVar12[0] = auVar8[0];
  auVar12[1] = auVar70[0];
  auVar71[1] = auVar70[8];
  auVar71[0] = auVar70[8];
  auVar71[2] = auVar70[9];
  auVar71[3] = auVar70[9];
  auVar71[4] = auVar70[10];
  auVar71[5] = auVar70[10];
  auVar71[6] = auVar70[0xb];
  auVar71[7] = auVar70[0xb];
  auVar71[8] = auVar70[0xc];
  auVar71[9] = auVar70[0xc];
  auVar71[10] = auVar70[0xd];
  auVar71[0xb] = auVar70[0xd];
  auVar71[0xc] = auVar70[0xe];
  auVar71[0xd] = auVar70[0xe];
  auVar71[0xf] = auVar70[0xf];
  auVar71[0xe] = auVar71[0xf];
  auVar8 = psraw(auVar12,0xb);
  auVar29 = psraw(auVar71,0xb);
  auVar8 = packsswb(auVar8,auVar29);
  auVar79._0_14_ = auVar29._0_14_;
  auVar79[0xe] = auVar29[7];
  auVar79[0xf] = auVar118[7];
  auVar78._14_2_ = auVar79._14_2_;
  auVar78._0_13_ = auVar29._0_13_;
  auVar78[0xd] = auVar118[6];
  auVar77._13_3_ = auVar78._13_3_;
  auVar77._0_12_ = auVar29._0_12_;
  auVar77[0xc] = auVar29[6];
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._0_11_ = auVar29._0_11_;
  auVar76[0xb] = auVar118[5];
  auVar75._11_5_ = auVar76._11_5_;
  auVar75._0_10_ = auVar29._0_10_;
  auVar75[10] = auVar29[5];
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._0_9_ = auVar29._0_9_;
  auVar74[9] = auVar118[4];
  auVar73._9_7_ = auVar74._9_7_;
  auVar73._0_8_ = auVar29._0_8_;
  auVar73[8] = auVar29[4];
  auVar72._8_8_ = auVar73._8_8_;
  auVar72[7] = auVar118[3];
  auVar72[6] = auVar29[3];
  auVar72[5] = auVar118[2];
  auVar72[4] = auVar29[2];
  auVar72[3] = auVar118[1];
  auVar72[2] = auVar29[1];
  auVar72[0] = auVar29[0];
  auVar72[1] = auVar118[0];
  auVar116[1] = auVar118[8];
  auVar116[0] = auVar115[8];
  auVar116[2] = auVar115[9];
  auVar116[3] = auVar118[9];
  auVar116[4] = auVar115[10];
  auVar116[5] = auVar118[10];
  auVar116[6] = auVar115[0xb];
  auVar116[7] = auVar118[0xb];
  auVar116[8] = auVar115[0xc];
  auVar116[9] = auVar118[0xc];
  auVar116[10] = auVar115[0xd];
  auVar116[0xb] = auVar118[0xd];
  auVar116[0xc] = auVar115[0xe];
  auVar116[0xd] = auVar118[0xe];
  auVar116[0xe] = auVar115[0xf];
  auVar116[0xf] = auVar118[0xf];
  auVar29 = psraw(auVar72,0xb);
  auVar113 = psraw(auVar116,0xb);
  auVar29 = packsswb(auVar29,auVar113);
  auVar18 = paddsb(auVar8,auVar18 ^ _DAT_001b71b0);
  auVar8 = psubsb(auVar9 ^ _DAT_001b71b0,auVar29);
  auVar18 = auVar18 ^ _DAT_001b71b0;
  auVar8 = auVar8 ^ _DAT_001b71b0;
  auVar29 = auVar29 ^ _DAT_001b71b0;
  cVar67 = pavgb(auVar29[0],0);
  cVar83 = pavgb(auVar29[1],0);
  cVar85 = pavgb(auVar29[2],0);
  cVar87 = pavgb(auVar29[3],0);
  cVar89 = pavgb(auVar29[4],0);
  cVar91 = pavgb(auVar29[5],0);
  cVar93 = pavgb(auVar29[6],0);
  cVar95 = pavgb(auVar29[7],0);
  cVar97 = pavgb(auVar29[8],0);
  cVar99 = pavgb(auVar29[9],0);
  cVar101 = pavgb(auVar29[10],0);
  cVar103 = pavgb(auVar29[0xb],0);
  cVar105 = pavgb(auVar29[0xc],0);
  cVar107 = pavgb(auVar29[0xd],0);
  cVar109 = pavgb(auVar29[0xe],0);
  cVar111 = pavgb(auVar29[0xf],0);
  auVar80[0] = cVar67 + -0x40;
  auVar80[1] = cVar83 + -0x40;
  auVar80[2] = cVar85 + -0x40;
  auVar80[3] = cVar87 + -0x40;
  auVar80[4] = cVar89 + -0x40;
  auVar80[5] = cVar91 + -0x40;
  auVar80[6] = cVar93 + -0x40;
  auVar80[7] = cVar95 + -0x40;
  auVar80[8] = cVar97 + -0x40;
  auVar80[9] = cVar99 + -0x40;
  auVar80[10] = cVar101 + -0x40;
  auVar80[0xb] = cVar103 + -0x40;
  auVar80[0xc] = cVar105 + -0x40;
  auVar80[0xd] = cVar107 + -0x40;
  auVar80[0xe] = cVar109 + -0x40;
  auVar80[0xf] = cVar111 + -0x40;
  auVar9 = psubsb(auVar10 ^ _DAT_001b71b0,auVar80 & auVar31);
  auVar81 = paddsb(auVar80 & auVar31,auVar81 ^ _DAT_001b71b0);
  auVar81 = auVar81 ^ _DAT_001b71b0;
  auVar9 = auVar9 ^ _DAT_001b71b0;
  *(long *)(u + lVar7 * 2) = auVar81._0_8_;
  *(long *)(v + lVar7 * 2) = auVar81._8_8_;
  *(long *)(u + lVar7 * 3) = auVar18._0_8_;
  *(long *)(v + lVar7 * 3) = auVar18._8_8_;
  *(long *)(u + lVar7 * 4) = auVar8._0_8_;
  *(long *)(v + lVar7 * 4) = auVar8._8_8_;
  *(long *)(u + lVar7 * 5) = auVar9._0_8_;
  *(long *)(v + lVar7 * 5) = auVar9._8_8_;
  return;
}

Assistant:

static void VFilter8i_SSE2(uint8_t* WEBP_RESTRICT u, uint8_t* WEBP_RESTRICT v,
                           int stride,
                           int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i t1, t2, p1, p0, q0, q1;

  // Load p3, p2, p1, p0
  LOADUV_H_EDGES4(u, v, stride, t2, t1, p1, p0);
  MAX_DIFF1(t2, t1, p1, p0, mask);

  u += 4 * stride;
  v += 4 * stride;

  // Load q0, q1, q2, q3
  LOADUV_H_EDGES4(u, v, stride, q0, q1, t1, t2);
  MAX_DIFF2(t2, t1, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter4_SSE2(&p1, &p0, &q0, &q1, &mask, hev_thresh);

  // Store
  STOREUV(p1, u, v, -2 * stride);
  STOREUV(p0, u, v, -1 * stride);
  STOREUV(q0, u, v, 0 * stride);
  STOREUV(q1, u, v, 1 * stride);
}